

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* __thiscall
args::NamedBase::GetDescription_abi_cxx11_
          (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           *__return_storage_ptr__,NamedBase *this,HelpParams *params,uint indentLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  undefined4 in_register_0000000c;
  string *delimiter;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  description;
  string local_138;
  char *local_118;
  size_type local_110;
  char local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_b0;
  undefined1 local_a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_70 [32];
  string local_50;
  
  delimiter = (string *)CONCAT44(in_register_0000000c,indentLevel);
  paVar1 = &local_138.field_2;
  local_118 = &local_108;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_110 = 0;
  local_108 = '\0';
  local_138._M_dataplus._M_p = (pointer)paVar1;
  (*(this->super_Base)._vptr_Base[0x11])(local_f8);
  std::__cxx11::string::operator=((string *)&local_118,(string *)local_f8);
  if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != local_f8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
  }
  std::__cxx11::string::_M_assign((string *)&local_138);
  local_a8._0_8_ = local_a8 + 0x10;
  bVar2 = this->choicesStringManual;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,", ","");
  local_b0 = __return_storage_ptr__;
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_f8,(detail *)&this->choicesStrings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,delimiter);
  bVar3 = params->addChoices;
  (*(this->super_Base)._vptr_Base[0x10])(&local_88,this,params);
  local_70._0_8_ = (pointer)(local_70 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,", ","");
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_50,(detail *)&local_88,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70,delimiter);
  AddDescriptionPostfix
            (this,&local_138,bVar2,(string *)local_f8,bVar3,&local_50,&params->choiceString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != local_f8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
  }
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_);
  }
  bVar2 = this->defaultStringManual;
  bVar3 = params->addDefault;
  (*(this->super_Base)._vptr_Base[0xf])(local_f8,this,params);
  AddDescriptionPostfix
            (this,&local_138,bVar2,&this->defaultString,bVar3,(string *)local_f8,
             &params->defaultString);
  this_00 = local_b0;
  if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != local_f8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
  }
  local_c8 = local_110;
  local_f8._16_8_ = local_138._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar1) {
    local_e0._8_8_ = local_138.field_2._8_8_;
    local_f8._8_8_ = &local_e0;
  }
  else {
    local_f8._8_8_ = local_138._M_dataplus._M_p;
  }
  local_e0._M_allocated_capacity._1_7_ = local_138.field_2._M_allocated_capacity._1_7_;
  local_e0._M_local_buf[0] = local_138.field_2._M_local_buf[0];
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  if (local_118 == &local_108) {
    uStack_b8 = uStack_100;
    local_d0._M_p = &local_c0;
  }
  else {
    local_d0._M_p = local_118;
  }
  uStack_bf = uStack_107;
  local_c0 = local_108;
  local_110 = 0;
  local_108 = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_f8;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  local_118 = &local_108;
  local_f8._0_4_ = indentLevel;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(this_00,__l,(allocator_type *)local_a8);
  if (local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._8_8_ != &local_e0) {
    operator_delete((void *)local_f8._8_8_);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  return this_00;
}

Assistant:

virtual std::vector<std::tuple<std::string, std::string, unsigned>> GetDescription(const HelpParams &params, const unsigned indentLevel) const override
            {
                std::tuple<std::string, std::string, unsigned> description;
                std::get<0>(description) = GetNameString(params);
                std::get<1>(description) = help;
                std::get<2>(description) = indentLevel;

                AddDescriptionPostfix(std::get<1>(description), choicesStringManual, detail::Join(choicesStrings, ", "), params.addChoices, detail::Join(GetChoicesStrings(params), ", "), params.choiceString);
                AddDescriptionPostfix(std::get<1>(description), defaultStringManual, defaultString, params.addDefault, GetDefaultString(params), params.defaultString);

                return { std::move(description) };
            }